

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

BOOLEAN __thiscall
BVSparse<Memory::ArenaAllocator>::Test(BVSparse<Memory::ArenaAllocator> *this,BVIndex i)

{
  BOOLEAN BVar1;
  BVIndex index;
  SparseBVUnit *this_00;
  BVIndex i_local;
  BVSparse<Memory::ArenaAllocator> *this_local;
  
  this_00 = BitsFromIndex(this,i);
  index = BVUnitT<unsigned_long>::Offset(i);
  BVar1 = BVUnitT<unsigned_long>::Test(this_00,index);
  return BVar1;
}

Assistant:

BOOLEAN
BVSparse<TAllocator>::Test(BVIndex i) const
{
    return this->BitsFromIndex(i)->Test(SparseBVUnit::Offset(i));
}